

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

void __thiscall Memory::CacheAllocator::CheckIsAllZero(CacheAllocator *this,bool lockdown)

{
  code *pcVar1;
  bool bVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 *in_FS_OFFSET;
  DWORD local_30;
  DWORD local_2c;
  DWORD oldProtect_1;
  DWORD oldProtect;
  BigBlock *blockp;
  ArenaMemoryBlock *memoryBlock;
  CacheAllocator *pCStack_10;
  bool lockdown_local;
  CacheAllocator *this_local;
  
  blockp = *(BigBlock **)(this + 0x20);
  memoryBlock._7_1_ = lockdown;
  pCStack_10 = this;
  do {
    if (blockp == (BigBlock *)0x0) {
      if ((((byte)this[0x80] & 1) == 0) || ((memoryBlock._7_1_ & 1) == 0)) {
        ArenaData::UpdateCacheBlock((ArenaData *)(this + 0x10));
        for (_oldProtect_1 = *(BigBlock **)(this + 0x10); _oldProtect_1 != (BigBlock *)0x0;
            _oldProtect_1 = (_oldProtect_1->super_ArenaMemoryBlock).field_0.nextBigBlock) {
          pbVar3 = (byte *)BigBlock::GetBytes(_oldProtect_1);
          bVar2 = IsAll(pbVar3,_oldProtect_1->currentByte,'\0');
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                               ,0x5fd,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                               "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          if ((memoryBlock._7_1_ & 1) != 0) {
            pcVar4 = PageAllocation::GetAddress(_oldProtect_1->allocation);
            sVar5 = PageAllocation::GetSize(_oldProtect_1->allocation);
            VirtualProtect(pcVar4,sVar5,2,&local_2c);
          }
        }
        for (_oldProtect_1 = *(BigBlock **)(this + 0x18); _oldProtect_1 != (BigBlock *)0x0;
            _oldProtect_1 = (_oldProtect_1->super_ArenaMemoryBlock).field_0.nextBigBlock) {
          pbVar3 = (byte *)BigBlock::GetBytes(_oldProtect_1);
          bVar2 = IsAll(pbVar3,_oldProtect_1->currentByte,'\0');
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                               ,0x609,"(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0))",
                               "IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          if ((memoryBlock._7_1_ & 1) != 0) {
            pcVar4 = PageAllocation::GetAddress(_oldProtect_1->allocation);
            sVar5 = PageAllocation::GetSize(_oldProtect_1->allocation);
            VirtualProtect(pcVar4,sVar5,2,&local_30);
          }
        }
        if ((memoryBlock._7_1_ & 1) != 0) {
          this[0x80] = (CacheAllocator)0x1;
        }
      }
      return;
    }
    pbVar3 = (byte *)ArenaMemoryBlock::GetBytes(&blockp->super_ArenaMemoryBlock);
    bVar2 = IsAll(pbVar3,(blockp->super_ArenaMemoryBlock).nbytes,'\0');
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0x5f1,"(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0))",
                         "IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    blockp = (blockp->super_ArenaMemoryBlock).field_0.nextBigBlock;
  } while( true );
}

Assistant:

void CacheAllocator::CheckIsAllZero(bool lockdown)
{
    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        Assert(IsAll((byte*)memoryBlock->GetBytes(), memoryBlock->nbytes, 0));
        memoryBlock = memoryBlock->next;
    }

    if (verifiedAllZeroAndLockedDown && lockdown)
    {
        return;
    }
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        Assert(IsAll((byte*)blockp->GetBytes(), blockp->currentByte, 0));
        if (lockdown)
        {
            DWORD oldProtect;
            VirtualProtect(blockp->allocation->GetAddress(), blockp->allocation->GetSize(), PAGE_READONLY, &oldProtect);
        }
        blockp = blockp->nextBigBlock;
    }

    if (lockdown)
    {
        verifiedAllZeroAndLockedDown = true;
    }
}